

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv__fs_stat(char *path,uv_stat_t *buf)

{
  undefined1 local_b0 [4];
  int ret;
  stat pbuf;
  uv_stat_t *buf_local;
  char *path_local;
  
  pbuf.__glibc_reserved[2] = (__syscall_slong_t)buf;
  path_local._4_4_ = uv__fs_statx(-1,path,0,0,buf);
  if ((path_local._4_4_ == -0x26) &&
     (path_local._4_4_ = stat64(path,(stat64 *)local_b0), path_local._4_4_ == 0)) {
    uv__to_stat((stat *)local_b0,(uv_stat_t *)pbuf.__glibc_reserved[2]);
  }
  return path_local._4_4_;
}

Assistant:

static int uv__fs_stat(const char *path, uv_stat_t *buf) {
  struct stat pbuf;
  int ret;

  ret = uv__fs_statx(-1, path, /* is_fstat */ 0, /* is_lstat */ 0, buf);
  if (ret != UV_ENOSYS)
    return ret;

  ret = stat(path, &pbuf);
  if (ret == 0)
    uv__to_stat(&pbuf, buf);

  return ret;
}